

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t rebuild_hflags_internal(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  int fp_el_00;
  ARMMMUIdx mmu_idx_00;
  ARMMMUIdx mmu_idx;
  int fp_el;
  int el;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  fp_el_00 = fp_exception_el_aarch64(env,iVar2);
  mmu_idx_00 = arm_mmu_idx_el_aarch64(env,iVar2);
  _Var1 = is_a64(env);
  if (_Var1) {
    env_local._4_4_ = rebuild_hflags_a64(env,iVar2,fp_el_00,mmu_idx_00);
  }
  else {
    iVar2 = arm_feature(env,9);
    if (iVar2 == 0) {
      env_local._4_4_ = rebuild_hflags_a32(env,fp_el_00,mmu_idx_00);
    }
    else {
      env_local._4_4_ = rebuild_hflags_m32(env,fp_el_00,mmu_idx_00);
    }
  }
  return env_local._4_4_;
}

Assistant:

static uint32_t rebuild_hflags_internal(CPUARMState *env)
{
    int el = arm_current_el(env);
    int fp_el = fp_exception_el(env, el);
    ARMMMUIdx mmu_idx = arm_mmu_idx_el(env, el);

    if (is_a64(env)) {
        return rebuild_hflags_a64(env, el, fp_el, mmu_idx);
    } else if (arm_feature(env, ARM_FEATURE_M)) {
        return rebuild_hflags_m32(env, fp_el, mmu_idx);
    } else {
        return rebuild_hflags_a32(env, fp_el, mmu_idx);
    }
}